

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.h
# Opt level: O0

void __thiscall
DIS::LinearSegmentParameter::LinearSegmentParameter
          (LinearSegmentParameter *this,LinearSegmentParameter *param_1)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  LinearSegmentParameter *param_1_local;
  LinearSegmentParameter *this_local;
  
  this->_vptr_LinearSegmentParameter = (_func_int **)&PTR__LinearSegmentParameter_00272648;
  this->_segmentNumber = param_1->_segmentNumber;
  SixByteChunk::SixByteChunk(&this->_segmentAppearance,&param_1->_segmentAppearance);
  Vector3Double::Vector3Double(&this->_location,&param_1->_location);
  Orientation::Orientation(&this->_orientation,&param_1->_orientation);
  uVar1 = param_1->_segmentWidth;
  uVar2 = param_1->_segmentHeight;
  uVar3 = param_1->_segmentDepth;
  this->_segmentLength = param_1->_segmentLength;
  this->_segmentWidth = uVar1;
  this->_segmentHeight = uVar2;
  this->_segmentDepth = uVar3;
  this->_pad1 = param_1->_pad1;
  return;
}

Assistant:

class OPENDIS6_EXPORT LinearSegmentParameter
{
protected:
  /** number of segments */
  unsigned char _segmentNumber; 

  /** segment appearance */
  SixByteChunk _segmentAppearance; 

  /** location */
  Vector3Double _location; 

  /** orientation */
  Orientation _orientation; 

  /** segmentLength */
  unsigned short _segmentLength; 

  /** segmentWidth */
  unsigned short _segmentWidth; 

  /** segmentHeight */
  unsigned short _segmentHeight; 

  /** segment Depth */
  unsigned short _segmentDepth; 

  /** segment Depth */
  unsigned int _pad1; 


 public:
    LinearSegmentParameter();
    virtual ~LinearSegmentParameter();

    virtual void marshal(DataStream& dataStream) const;
    virtual void unmarshal(DataStream& dataStream);

    unsigned char getSegmentNumber() const; 
    void setSegmentNumber(unsigned char pX); 

    SixByteChunk& getSegmentAppearance(); 
    const SixByteChunk&  getSegmentAppearance() const; 
    void setSegmentAppearance(const SixByteChunk    &pX);

    Vector3Double& getLocation(); 
    const Vector3Double&  getLocation() const; 
    void setLocation(const Vector3Double    &pX);

    Orientation& getOrientation(); 
    const Orientation&  getOrientation() const; 
    void setOrientation(const Orientation    &pX);

    unsigned short getSegmentLength() const; 
    void setSegmentLength(unsigned short pX); 

    unsigned short getSegmentWidth() const; 
    void setSegmentWidth(unsigned short pX); 

    unsigned short getSegmentHeight() const; 
    void setSegmentHeight(unsigned short pX); 

    unsigned short getSegmentDepth() const; 
    void setSegmentDepth(unsigned short pX); 

    unsigned int getPad1() const; 
    void setPad1(unsigned int pX); 


virtual int getMarshalledSize() const;

     bool operator  ==(const LinearSegmentParameter& rhs) const;
}